

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

bool __thiscall
WorldShuffler::test_item_source_compatibility(WorldShuffler *this,ItemSource *source,Item *item)

{
  ItemSource *this_00;
  bool bVar1;
  mapped_type *ppWVar2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range2;
  pointer ppIVar3;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources_in_node;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_48;
  
  bVar1 = ItemSource::is_chest(source);
  if (bVar1) {
    return true;
  }
  bVar1 = ItemSource::is_npc_reward(source);
  if (!bVar1) {
    if (item->_id < 0x40) {
      bVar1 = ItemSource::is_shop_item(source);
      if (!bVar1) {
        return true;
      }
      if (item->_id != '?') {
        ppWVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                  ::at(&this->_world->_nodes,&source->_node_id);
        std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector
                  (&local_48,&(*ppWVar2)->_item_sources);
        ppIVar3 = local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while( true ) {
          if (ppIVar3 ==
              local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            if (local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              return true;
            }
            operator_delete(local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            return true;
          }
          this_00 = *ppIVar3;
          if (((this_00 != source) && (bVar1 = ItemSource::is_shop_item(this_00), bVar1)) &&
             (this_00->_item == item)) break;
          ppIVar3 = ppIVar3 + 1;
        }
        if (local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    return false;
  }
  return true;
}

Assistant:

bool WorldShuffler::test_item_source_compatibility(ItemSource* source, Item* item) const
{
    if(source->is_chest() || source->is_npc_reward())
        return true;

    ItemSourceOnGround* cast_source = reinterpret_cast<ItemSourceOnGround*>(source);
    if(item->id() >= ITEM_GOLDS_START)
        return false;

    if(source->is_shop_item())
    {
        if(item->id() == ITEM_NONE)
            return false;

        // If another shop source in the same node contains the same item, deny item placement
        WorldNode* shop_node = _world.node(source->node_id());
        const std::vector<ItemSource*> sources_in_node = shop_node->item_sources();
        for(ItemSource* source_in_node : sources_in_node)
            if(source_in_node != source && source_in_node->is_shop_item() && source_in_node->item() == item)
                return false;
    }

    return true;
}